

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O0

DistributionMapping amrex::DistributionMapping::makeSFC(MultiFab *weight,Real *eff,bool sort)

{
  byte bVar1;
  byte in_CL;
  BoxArray *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  FabArrayBase *in_RSI;
  element_type *in_RDI;
  DistributionMapping DVar2;
  int nprocs;
  Vector<long,_std::allocator<long>_> cost;
  DistributionMapping *r;
  undefined1 in_stack_ffffffffffffffcf;
  Real *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined7 in_stack_ffffffffffffffe0;
  
  bVar1 = in_CL & 1;
  anon_unknown_22::gather_weights
            ((MultiFab *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  ParallelContext::NProcsSub();
  DistributionMapping((DistributionMapping *)0xf5b86f);
  FabArrayBase::boxArray(in_RSI);
  SFCProcessorMap((DistributionMapping *)in_RSI,in_RDX,
                  (vector<long,_std::allocator<long>_> *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                  in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0,
                  (bool)in_stack_ffffffffffffffcf);
  Vector<long,_std::allocator<long>_>::~Vector((Vector<long,_std::allocator<long>_> *)0xf5b8ee);
  DVar2.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  DVar2.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (DistributionMapping)
         DVar2.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

DistributionMapping
DistributionMapping::makeSFC (const MultiFab& weight, Real& eff, bool sort)
{
    BL_PROFILE("makeSFC");
    Vector<Long> cost = gather_weights(weight);
    int nprocs = ParallelContext::NProcsSub();
    DistributionMapping r;
    r.SFCProcessorMap(weight.boxArray(), cost, nprocs, eff, sort);
    return r;
}